

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Action<ot::commissioner::Error_(ot::commissioner::PendingOperationalDataset_&,_unsigned_short)> *
__thiscall
testing::internal::
OnCallSpec<ot::commissioner::Error_(ot::commissioner::PendingOperationalDataset_&,_unsigned_short)>
::GetAction(OnCallSpec<ot::commissioner::Error_(ot::commissioner::PendingOperationalDataset_&,_unsigned_short)>
            *this)

{
  int iVar1;
  allocator local_39;
  string local_38;
  
  iVar1 = *(int *)(this + 0xc);
  std::__cxx11::string::string
            ((string *)&local_38,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_39);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (Action<ot::commissioner::Error_(ot::commissioner::PendingOperationalDataset_&,_unsigned_short)>
          *)(this + 0x58);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }